

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_info.cc
# Opt level: O3

void lf::mesh::utils::PrintInfo(ostream *stream,Entity *e,int output_ctrl)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 uVar3;
  int iVar4;
  dim_t dVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  size_t sVar7;
  undefined4 extraout_var_00;
  long extraout_RDX;
  long i;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  RefEl e_ref_el;
  RefEl sub_ent_refel;
  stringstream ss;
  RefEl local_23d;
  uint local_23c;
  long *local_238;
  string local_230;
  string local_210;
  string local_1f0;
  ulong local_1d0;
  MatrixXd *local_1c8;
  Entity *local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  local_23c = output_ctrl;
  iVar4 = (*e->_vptr_Entity[4])(e);
  local_23d.type_ = (RefElType)iVar4;
  dVar5 = base::internal::DimensionImpl(local_23d.type_);
  local_1c0 = e;
  iVar4 = (*e->_vptr_Entity[3])(e);
  local_238 = (long *)CONCAT44(extraout_var,iVar4);
  if (local_238 != (long *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"Entity ",7);
    base::RefEl::ToString_abi_cxx11_((string *)local_1b8,&local_23d);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,(char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),local_1b8._8_8_);
    if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                      local_1a8[0]._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"/",1);
    pcVar9 = *(char **)(*(long *)(*local_238 + -8) + 8);
    pcVar9 = pcVar9 + (*pcVar9 == '*');
    sVar7 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,sVar7);
    local_1b8[0] = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_1b8,1);
    if (10 < (int)local_23c) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"Dimension: ",0xb);
      uVar8 = (ulong)dVar5;
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
      local_1b8[0] = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_1b8,1);
      local_1c8 = base::RefEl::NodeCoords(&local_23d);
      if (dVar5 != 0) {
        do {
          base::RefEl::NumSubEntities(&local_23d,(dim_t)uVar8);
          local_1b8[0] = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)0xa;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)local_1b8,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Codimension ",0xc);
          local_1d0 = uVar8;
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," sub-entities",0xd);
          local_1b8[0] = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_1b8,1);
          if (0x32 < local_23c) {
            iVar4 = (*local_1c0->_vptr_Entity[1])(local_1c0,local_1d0);
            if (extraout_RDX != 0) {
              lVar10 = extraout_RDX << 3;
              i = 0;
              do {
                uVar3 = (**(code **)(**(long **)(CONCAT44(extraout_var_00,iVar4) + i * 8) + 0x20))()
                ;
                local_1f0._M_dataplus._M_p._0_1_ = uVar3;
                std::__ostream_insert<char,std::char_traits<char>>(stream,"* Subentity ",0xc);
                poVar6 = (ostream *)std::ostream::operator<<(stream,(int)i);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
                base::RefEl::ToString_abi_cxx11_((string *)local_1b8,(RefEl *)&local_1f0);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar6,(char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                                    local_1b8._8_8_);
                if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
                  operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                                  local_1a8[0]._M_allocated_capacity + 1);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
                local_1b8[0] = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)0xa;
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_1b8,1);
                if (0x5a < local_23c) {
                  (**(code **)(*local_238 + 0x18))(&local_230,local_238,local_1c8);
                  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                             local_1b8,(Matrix<double,__1,__1,_0,__1,__1> *)&local_230,i);
                  poVar6 = Eigen::operator<<(stream,(
                                                  DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                                                  *)local_1b8);
                  local_210._M_dataplus._M_p._0_1_ = 10;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_210,1);
                  free(local_230._M_dataplus._M_p);
                }
                i = i + 1;
                lVar10 = lVar10 + -8;
              } while (lVar10 != 0);
            }
          }
          uVar8 = local_1d0 - 1;
        } while ((int)uVar8 != 0);
      }
      if ((0x5a < (int)local_23c) && (local_23d.type_ == kPoint)) {
        (**(code **)(*local_238 + 0x18))
                  ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1b8,local_238,
                   local_1c8);
        poVar6 = Eigen::operator<<(stream,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                          local_1b8);
        local_230._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_230,1);
        free((void *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
      }
      std::__ostream_insert<char,std::char_traits<char>>(stream,"-----------------------",0x17);
      local_1b8[0] = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(stream,local_1b8,1);
    }
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),"Missing geometry information!",0x1d);
  paVar1 = &local_230.field_2;
  local_230._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"e_geo_ptr != nullptr","");
  paVar2 = &local_210.field_2;
  local_210._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/print_info.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_230,&local_210,0x51,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar1) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  local_230._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"false","");
  local_210._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/print_info.cc"
             ,"");
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
  base::AssertionFailed(&local_230,&local_210,0x51,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  abort();
}

Assistant:

void PrintInfo(std::ostream &stream, const lf::mesh::Entity &e,
               int output_ctrl) {
  // Topological type of entity
  const lf::base::RefEl e_ref_el = e.RefEl();
  const base::dim_t dim_ref_el = e_ref_el.Dimension();
  // Geometry of entity and coordinates
  const geometry::Geometry *e_geo_ptr = e.Geometry();
  LF_ASSERT_MSG(e_geo_ptr != nullptr, "Missing geometry information!");

  stream << "Entity " << e_ref_el << "/" << typeid(*e_geo_ptr).name() << '\n';

  if (output_ctrl > 10) {
    stream << "Dimension: " << dim_ref_el << '\n';

    const Eigen::MatrixXd &ref_el_corners(e_ref_el.NodeCoords());

    // Loop over codimensions
    for (base::dim_t co_dim = dim_ref_el; co_dim > 0; co_dim--) {
      const base::size_type num_sub_ent = e_ref_el.NumSubEntities(co_dim);
      stream << '\n'
             << "Codimension " << co_dim << ": " << num_sub_ent
             << " sub-entities" << '\n';

      if (output_ctrl > 50) {
        int sub_ent_num = 0;
        // Loop over subentities
        for (const Entity *sub_ent : e.SubEntities(co_dim)) {
          const lf::base::RefEl sub_ent_refel = sub_ent->RefEl();
          stream << "* Subentity " << sub_ent_num << " (" << sub_ent_refel
                 << ")" << '\n';

          if (output_ctrl > 90) {
            // Print coordinates
            stream << e_geo_ptr->Global(ref_el_corners).col(sub_ent_num)
                   << '\n';
          }

          sub_ent_num += 1;

        }  // loop sub-ent
      }  // if output ctrl
    }  // loop codim

    if (e_ref_el == lf::base::RefEl::kPoint() && output_ctrl > 90) {
      stream << e_geo_ptr->Global(ref_el_corners) << '\n';
    }

    stream << "-----------------------" << '\n';

  }  // if
}